

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

string * libtorrent::remove_extension(string *__return_storage_ptr__,string *f)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  char *ext;
  char *slash;
  string *f_local;
  
  pcVar1 = (char *)::std::__cxx11::string::c_str();
  pcVar1 = strrchr(pcVar1,0x2f);
  pcVar2 = (char *)::std::__cxx11::string::c_str();
  pcVar2 = strrchr(pcVar2,0x2e);
  if (((pcVar2 != (char *)0x0) &&
      (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)f), pcVar2 != pcVar3)) &&
     ((pcVar1 == (char *)0x0 || (pcVar1 <= pcVar2)))) {
    lVar4 = ::std::__cxx11::string::operator[]((ulong)f);
    aux::numeric_cast<unsigned_long,long,void>((long)pcVar2 - lVar4);
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)f);
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)f);
  return __return_storage_ptr__;
}

Assistant:

std::string remove_extension(std::string const& f)
	{
		char const* slash = std::strrchr(f.c_str(), '/');
#ifdef TORRENT_WINDOWS
		slash = std::max((char const*)std::strrchr(f.c_str(), '\\'), slash);
#endif
		char const* ext = std::strrchr(f.c_str(), '.');
		// if we don't have an extension, just return f
		if (ext == nullptr || ext == &f[0] || (slash != nullptr && ext < slash)) return f;
		return f.substr(0, aux::numeric_cast<std::size_t>(ext - &f[0]));
	}